

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O3

int __thiscall MSH::mesh_file::scan_Nodes(mesh_file *this,fstream *mesh_file,string *line_buffer)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  size_type sVar6;
  int *piVar7;
  long lVar8;
  undefined8 uVar9;
  char *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_str_vec;
  pair<const_int,_MSH::node> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  fstream *local_78;
  mesh_file *local_70;
  double local_68;
  double local_60;
  char *local_58;
  char *local_50;
  anon_union_16_2_ba345be5_for_m_Storage local_48;
  ulong local_38;
  
  local_70 = this;
  iVar5 = std::__cxx11::string::compare((char *)line_buffer);
  local_78 = mesh_file;
  do {
    if (iVar5 == 0) {
      return 0;
    }
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)mesh_file + -0x18) + (char)mesh_file);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)mesh_file,(string *)line_buffer,cVar4);
    local_b8._0_8_ = "\r";
    local_b8.second.x = 7.5876180966634e-318;
    sVar6 = line_buffer->_M_string_length;
    if (sVar6 != 0) {
      pcVar10 = (line_buffer->_M_dataplus)._M_p;
      do {
        if (*pcVar10 == '\r') {
          boost::algorithm::detail::
          find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                    (line_buffer,pcVar10,pcVar10 + 1);
          break;
        }
        pcVar10 = pcVar10 + 1;
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
    }
    iVar5 = std::__cxx11::string::compare((char *)line_buffer);
    if (iVar5 == 0) {
      return 0;
    }
    iVar5 = check_read_state(mesh_file);
    if (iVar5 != 0) {
      return 1;
    }
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8._0_8_ = " ";
    local_b8.second.x = 7.63934182912652e-318;
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_48,(iterator_range<const_char_*> *)&local_b8);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&local_98,line_buffer,(is_any_ofF<char> *)&local_48,token_compress_off);
    if ((0x10 < local_38) && (local_48.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_48.m_dynSet);
    }
    if ((long)local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x80) {
      pcVar10 = local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar7 = __errno_location();
      iVar5 = *piVar7;
      *piVar7 = 0;
      pcVar2 = (char *)strtod(pcVar10,(char **)&local_b8);
      if ((char *)local_b8._0_8_ == pcVar10) {
LAB_0013f404:
        std::__throw_invalid_argument("stod");
LAB_0013f410:
        std::__throw_out_of_range("stoi");
LAB_0013f41c:
        std::__throw_out_of_range("stod");
      }
      else {
        iVar1 = *piVar7;
        local_58 = pcVar2;
        if (iVar1 != 0) {
          iVar5 = iVar1;
          if (iVar1 != 0x22) goto LAB_0013f26a;
          goto LAB_0013f41c;
        }
        *piVar7 = iVar5;
LAB_0013f26a:
        pcVar10 = local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        *piVar7 = 0;
        dVar3 = strtod(pcVar10,(char **)&local_b8);
        if ((char *)local_b8._0_8_ == pcVar10) {
LAB_0013f3f8:
          std::__throw_invalid_argument("stod");
          goto LAB_0013f404;
        }
        iVar1 = *piVar7;
        local_60 = dVar3;
        if (iVar1 == 0) {
          *piVar7 = iVar5;
LAB_0013f2b4:
          pcVar10 = local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          *piVar7 = 0;
          dVar3 = strtod(pcVar10,(char **)&local_b8);
          if ((char *)local_b8._0_8_ == pcVar10) {
LAB_0013f3ec:
            std::__throw_invalid_argument("stod");
            goto LAB_0013f3f8;
          }
          iVar1 = *piVar7;
          local_68 = dVar3;
          if (iVar1 == 0) {
            *piVar7 = iVar5;
          }
          else {
            iVar5 = iVar1;
            if (iVar1 == 0x22) goto LAB_0013f434;
          }
          pcVar10 = ((local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          *piVar7 = 0;
          lVar8 = strtol(pcVar10,&local_50,10);
          if (local_50 == pcVar10) {
            std::__throw_invalid_argument("stoi");
            goto LAB_0013f3ec;
          }
          if (((int)lVar8 == lVar8) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar5;
            }
            local_b8.first = (int)lVar8;
            local_b8.second.x = (double)local_58;
            local_b8.second.y = local_60;
            local_b8.second.z = local_68;
            std::
            _Rb_tree<int,std::pair<int_const,MSH::node>,std::_Select1st<std::pair<int_const,MSH::node>>,std::less<int>,std::allocator<std::pair<int_const,MSH::node>>>
            ::_M_insert_unique<std::pair<int_const,MSH::node>>
                      ((_Rb_tree<int,std::pair<int_const,MSH::node>,std::_Select1st<std::pair<int_const,MSH::node>>,std::less<int>,std::allocator<std::pair<int_const,MSH::node>>>
                        *)local_70,&local_b8);
            mesh_file = local_78;
            goto LAB_0013f39d;
          }
          goto LAB_0013f410;
        }
        iVar5 = iVar1;
        if (iVar1 != 0x22) goto LAB_0013f2b4;
      }
      std::__throw_out_of_range("stod");
LAB_0013f434:
      uVar9 = std::__throw_out_of_range("stod");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      _Unwind_Resume(uVar9);
    }
LAB_0013f39d:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    iVar5 = std::__cxx11::string::compare((char *)line_buffer);
  } while( true );
}

Assistant:

int MSH::mesh_file::scan_Nodes(std::fstream &mesh_file, std::string &line_buffer)
{
    while (line_buffer!="EndNodes")
    {
        getline(mesh_file,line_buffer);
        boost::erase_all(line_buffer, "\r");
        if (line_buffer=="$EndNodes")
            break;
        if (check_read_state(mesh_file))
            return EXIT_FAILURE;
        std::vector<std::string> split_str_vec;
        boost::split(split_str_vec, line_buffer, boost::is_any_of(" "));
        if (split_str_vec.size()==4)
        {
            node input_node;
            input_node.x = std::stod(split_str_vec[1]);
            input_node.y = std::stod(split_str_vec[2]);
            input_node.z = std::stod(split_str_vec[3]);
            nodes_map.insert({std::stoi(split_str_vec[0]),input_node});
        }
    }
    return EXIT_SUCCESS;
}